

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O1

void __thiscall txreconciliation_tests::RegisterPeerTest::test_method(RegisterPeerTest *this)

{
  bool bVar1;
  readonly_property<bool> rVar2;
  ReconciliationRegisterResult RVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  TxReconciliationTracker tracker;
  char *pcVar6;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  undefined4 local_100;
  ReconciliationRegisterResult local_fc;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  TxReconciliationTracker local_b8;
  undefined4 *local_b0;
  assertion_result local_a8;
  undefined4 **local_90;
  ReconciliationRegisterResult *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker(&local_b8,1);
  TxReconciliationTracker::PreRegisterPeer(&local_b8,0);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000018;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_fc = TxReconciliationTracker::RegisterPeer(&local_b8,0,true,0,0);
  local_88 = &local_fc;
  local_b0 = &local_100;
  local_100 = 3;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_fc == PROTOCOL_VIOLATION);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_58 = "";
  local_68 = (lazy_ostream *)&local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b0eb0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013b0eb0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar6 = "tracker.RegisterPeer( 0, true, 0, salt)";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_f8,1,2,REQUIRE,0xf688ef,(size_t)&local_60,0x18,
             &local_80,"ReconciliationRegisterResult::PROTOCOL_VIOLATION",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1b;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "!tracker.IsPeerRegistered(0)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_128 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,2,0,WARN,(check_type)pcVar6,(size_t)&local_130,0x1b);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_fc = TxReconciliationTracker::RegisterPeer(&local_b8,0,true,1,0);
  local_100 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_fc == SUCCESS);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_fc;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b0eb0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_100;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013b0eb0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pcVar6 = "tracker.RegisterPeer(0, true, 1, salt)";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_f8,2,2,REQUIRE,0xf68965,(size_t)&local_60,0x1c,
             &local_80,"ReconciliationRegisterResult::SUCCESS",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1d;
  file_02.m_begin = (iterator)&local_160;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_170,
             msg_02);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)TxReconciliationTracker::IsPeerRegistered(&local_b8,0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "tracker.IsPeerRegistered(0)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_178 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,(check_type)pcVar6,(size_t)&local_180,0x1d);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1e;
  file_03.m_begin = (iterator)&local_190;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a0,
             msg_03);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,1);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "!tracker.IsPeerRegistered(1)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1a8 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,2,0,WARN,(check_type)pcVar6,(size_t)&local_1b0,0x1e);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  TxReconciliationTracker::PreRegisterPeer(&local_b8,1);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x20;
  file_04.m_begin = (iterator)&local_1c0;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d0,
             msg_04);
  RVar3 = TxReconciliationTracker::RegisterPeer(&local_b8,1,false,1,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(RVar3 == SUCCESS);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ =
       "tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::SUCCESS";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1d8 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,2,0,WARN,(check_type)pcVar6,(size_t)&local_1e0,0x20);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x21;
  file_05.m_begin = (iterator)&local_1f0;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_200,
             msg_05);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxReconciliationTracker::IsPeerRegistered(&local_b8,1);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "tracker.IsPeerRegistered(1)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_208 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,(check_type)pcVar6,(size_t)&local_210,0x21);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x24;
  file_06.m_begin = (iterator)&local_220;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_230,
             msg_06);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,2);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "!tracker.IsPeerRegistered(2)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_238 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,2,0,WARN,(check_type)pcVar6,(size_t)&local_240,0x24);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  TxReconciliationTracker::PreRegisterPeer(&local_b8,2);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x26;
  file_07.m_begin = (iterator)&local_250;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_260,
             msg_07);
  RVar3 = TxReconciliationTracker::RegisterPeer(&local_b8,2,true,2,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(RVar3 == SUCCESS);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "tracker.RegisterPeer(2, true, 2, salt) == ReconciliationRegisterResult::SUCCESS"
  ;
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_268 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,2,0,WARN,(check_type)pcVar6,(size_t)&local_270,0x26);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x27;
  file_08.m_begin = (iterator)&local_280;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
             msg_08);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxReconciliationTracker::IsPeerRegistered(&local_b8,2);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "tracker.IsPeerRegistered(2)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_298 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,(check_type)pcVar6,(size_t)&local_2a0,0x27);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2a;
  file_09.m_begin = (iterator)&local_2b0;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2c0,
             msg_09);
  RVar3 = TxReconciliationTracker::RegisterPeer(&local_b8,1,false,1,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar3 == ALREADY_REGISTERED);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ =
       "tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::ALREADY_REGISTERED"
  ;
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2c8 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,2,0,WARN,(check_type)pcVar6,(size_t)&local_2d0,0x2a);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2d;
  file_10.m_begin = (iterator)&local_2e0;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2f0,
             msg_10);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_fc = TxReconciliationTracker::RegisterPeer(&local_b8,100,true,1,0);
  local_100 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_fc == NOT_FOUND);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_fc;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b0eb0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_100;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013b0eb0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pcVar6 = "tracker.RegisterPeer(100, true, 1, salt)";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_f8,2,2,REQUIRE,0xf68ac3,(size_t)&local_60,0x2d,
             &local_80,"ReconciliationRegisterResult::NOT_FOUND",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x2e;
  file_11.m_begin = (iterator)&local_300;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_310,
             msg_11);
  bVar1 = TxReconciliationTracker::IsPeerRegistered(&local_b8,100);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8._0_8_ = "!tracker.IsPeerRegistered(100)";
  local_f8._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_318 = "";
  local_68 = (lazy_ostream *)local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,(check_type)pcVar6,(size_t)&local_320,0x2e);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  TxReconciliationTracker::~TxReconciliationTracker(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(RegisterPeerTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    const uint64_t salt = 0;

    // Prepare a peer for reconciliation.
    tracker.PreRegisterPeer(0);

    // Invalid version.
    BOOST_CHECK_EQUAL(tracker.RegisterPeer(/*peer_id=*/0, /*is_peer_inbound=*/true,
                                           /*peer_recon_version=*/0, salt),
                      ReconciliationRegisterResult::PROTOCOL_VIOLATION);

    // Valid registration (inbound and outbound peers).
    BOOST_REQUIRE(!tracker.IsPeerRegistered(0));
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(0, true, 1, salt), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(0));
    BOOST_REQUIRE(!tracker.IsPeerRegistered(1));
    tracker.PreRegisterPeer(1);
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(1));

    // Reconciliation version is higher than ours, should be able to register.
    BOOST_REQUIRE(!tracker.IsPeerRegistered(2));
    tracker.PreRegisterPeer(2);
    BOOST_REQUIRE(tracker.RegisterPeer(2, true, 2, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(2));

    // Try registering for the second time.
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::ALREADY_REGISTERED);

    // Do not register if there were no pre-registration for the peer.
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(100, true, 1, salt), ReconciliationRegisterResult::NOT_FOUND);
    BOOST_CHECK(!tracker.IsPeerRegistered(100));
}